

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait_test.c
# Opt level: O1

void test_wait_n(testing t)

{
  testing t_00;
  nsync_counter c;
  nsync_counter c_00;
  closure *pcVar1;
  nsync_note pnVar2;
  nsync_note pnVar3;
  char *pcVar4;
  long lVar5;
  code *pcVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  nsync_dll_element_s_ *pnVar11;
  bool bVar12;
  nsync_time nVar13;
  nsync_time nVar14;
  nsync_time abs_deadline;
  nsync_time abs_deadline_00;
  nsync_time abs_deadline_01;
  nsync_time abs_deadline_02;
  nsync_waitable_s **in_stack_ffffffffffffff90;
  undefined8 local_68;
  void *pvStack_60;
  undefined8 local_58;
  nsync_note pnStack_50;
  nsync_note local_48;
  int local_3c;
  testing local_38;
  
  local_3c = 0;
  local_38 = t;
  do {
    c = nsync::nsync_counter_new(0);
    local_68._0_4_ = 0;
    local_68._4_4_ = 0;
    pvStack_60 = (void *)0x0;
    local_58._0_4_ = 0;
    local_58._4_4_ = 0;
    pnStack_50 = (nsync_note)0x0;
    nVar13 = nsync::nsync_time_now();
    nVar14 = nsync::nsync_time_ms(100);
    nVar13 = nsync::nsync_time_add(nVar13,nVar14);
    nVar14.tv_sec = (_func_void_void_ptr *)nVar13.tv_nsec;
    local_48 = (nsync_note)nVar13.tv_sec;
    iVar7 = (uint)local_68 + 10;
    do {
      c_00 = nsync::nsync_counter_new(0);
      a_ensure_(&local_68,1,0x10);
      lVar5 = (long)(int)(uint)local_68;
      local_68._0_4_ = (uint)local_68 + 1;
      pcVar6 = (code *)(lVar5 * 0x10);
      *(nsync_counter *)((long)pvStack_60 + (long)pcVar6) = c_00;
      *(undefined1 **)((long)pvStack_60 + (long)&(((nsync_note)pcVar6)->parent_child_link).prev) =
           nsync::nsync_counter_waitable_funcs;
      if ((int)(uint)local_68 < iVar7) {
        iVar8 = 3;
        do {
          nsync::nsync_counter_add(c_00,1);
          nsync::nsync_counter_add(c,1);
          pcVar1 = (closure *)malloc(0x30);
          pcVar1->f0 = closure_f0_decrement;
          pcVar1[1].f0 = decrement_at;
          pcVar1[2].f0 = (_func_void_void_ptr *)c_00;
          pcVar1[3].f0 = (_func_void_void_ptr *)local_48;
          pcVar1[4].f0 = nVar14.tv_sec;
          pcVar1[5].f0 = (_func_void_void_ptr *)c;
          pcVar6 = (code *)local_48;
          closure_fork(pcVar1);
          bVar12 = iVar8 == 0;
          iVar8 = iVar8 + -1;
          if (bVar12) break;
        } while ((int)(uint)local_68 < iVar7);
      }
    } while ((int)(uint)local_68 < iVar7);
    iVar7 = (uint)local_68 + 10;
LAB_00104508:
    if ((int)(uint)local_68 < iVar7) {
      nVar13.tv_nsec = (__syscall_slong_t)pcVar6;
      nVar13.tv_sec = 999999999;
      pnVar2 = nsync::nsync_note_new((nsync *)0x0,(nsync_note)0x7fffffffffffffff,nVar13);
      a_ensure_(&local_68,1,0x10);
      lVar5 = (long)(int)(uint)local_68;
      local_68._0_4_ = (uint)local_68 + 1;
      *(nsync_note *)((long)pvStack_60 + lVar5 * 0x10) = pnVar2;
      *(undefined ***)((long)pvStack_60 + lVar5 * 0x10 + 8) = &nsync::nsync_note_waitable_funcs;
      nsync::nsync_counter_add(c,1);
      pcVar1 = (closure *)malloc(0x30);
      pcVar1->f0 = closure_f0_notify;
      pcVar1[1].f0 = notify_at;
      pcVar1[2].f0 = (_func_void_void_ptr *)pnVar2;
      pcVar1[3].f0 = (_func_void_void_ptr *)local_48;
      pcVar1[4].f0 = nVar14.tv_sec;
      pcVar1[5].f0 = (_func_void_void_ptr *)c;
      pcVar6 = (code *)local_48;
      closure_fork(pcVar1);
      if ((int)(uint)local_68 < iVar7) {
        iVar8 = 3;
        do {
          abs_deadline.tv_nsec = (__syscall_slong_t)pcVar6;
          abs_deadline.tv_sec = 999999999;
          pnVar3 = nsync::nsync_note_new
                             ((nsync *)pnVar2,(nsync_note)0x7fffffffffffffff,abs_deadline);
          a_ensure_(&local_68,1,0x10);
          lVar5 = (long)(int)(uint)local_68;
          local_68._0_4_ = (uint)local_68 + 1;
          pcVar6 = (code *)(lVar5 * 0x10);
          *(nsync_note *)((long)pvStack_60 + (long)pcVar6) = pnVar3;
          *(undefined ***)((long)pvStack_60 + (long)&(((nsync_note)pcVar6)->parent_child_link).prev)
               = &nsync::nsync_note_waitable_funcs;
          bVar12 = iVar8 == 0;
          iVar8 = iVar8 + -1;
          if (bVar12) break;
        } while ((int)(uint)local_68 < iVar7);
      }
      goto LAB_00104508;
    }
    iVar7 = (uint)local_68 + 10;
LAB_0010462d:
    t_00 = local_38;
    pnVar2 = local_48;
    if ((int)(uint)local_68 < iVar7) {
      nVar14.tv_nsec = (__syscall_slong_t)pcVar6;
      pnVar3 = nsync::nsync_note_new((nsync *)0x0,local_48,nVar14);
      a_ensure_(&local_68,1,0x10);
      lVar5 = (long)(int)(uint)local_68;
      local_68._0_4_ = (uint)local_68 + 1;
      *(nsync_note *)((long)pvStack_60 + lVar5 * 0x10) = pnVar3;
      *(undefined ***)((long)pvStack_60 + lVar5 * 0x10 + 8) = &nsync::nsync_note_waitable_funcs;
      nsync::nsync_counter_add(c,1);
      pcVar1 = (closure *)malloc(0x30);
      pcVar1->f0 = closure_f0_notify;
      pcVar6 = notify_at;
      pcVar1[1].f0 = notify_at;
      pcVar1[2].f0 = (_func_void_void_ptr *)pnVar3;
      pcVar1[3].f0 = (_func_void_void_ptr *)pnVar2;
      pcVar1[4].f0 = nVar14.tv_sec;
      pcVar1[5].f0 = (_func_void_void_ptr *)c;
      closure_fork(pcVar1);
      if ((int)(uint)local_68 < iVar7) {
        iVar8 = 3;
        do {
          abs_deadline_00.tv_nsec = (__syscall_slong_t)pcVar6;
          abs_deadline_00.tv_sec = 999999999;
          pnVar2 = nsync::nsync_note_new
                             ((nsync *)pnVar3,(nsync_note)0x7fffffffffffffff,abs_deadline_00);
          a_ensure_(&local_68,1,0x10);
          lVar5 = (long)(int)(uint)local_68;
          local_68._0_4_ = (uint)local_68 + 1;
          pcVar6 = (code *)(lVar5 * 0x10);
          *(nsync_note *)((long)pvStack_60 + (long)pcVar6) = pnVar2;
          *(undefined ***)((long)pvStack_60 + (long)&(((nsync_note)pcVar6)->parent_child_link).prev)
               = &nsync::nsync_note_waitable_funcs;
          bVar12 = iVar8 == 0;
          iVar8 = iVar8 + -1;
          if (bVar12) break;
        } while ((int)(uint)local_68 < iVar7);
      }
      goto LAB_0010462d;
    }
    if ((uint)local_68 != 0x1e) {
      pcVar4 = smprintf("array length not equal to number of counters");
      pcVar6 = (code *)0x66;
      testing_error_(t_00,1,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O1/cpp/testing/wait_test.c"
                     ,0x66,pcVar4);
    }
    if ((uint)local_68 != 0) {
      lVar5 = 0;
      uVar9 = 0;
      do {
        pnVar11 = (nsync_dll_element_s_ *)((long)pvStack_60 + lVar5);
        a_ensure_(&local_58,1,8);
        pcVar6 = (code *)(long)(int)local_58;
        local_58._0_4_ = (int)local_58 + 1;
        (&(pnStack_50->parent_child_link).next)[(long)pcVar6] = pnVar11;
        uVar9 = uVar9 + 1;
        lVar5 = lVar5 + 0x10;
      } while (uVar9 != (uint)local_68);
    }
    while ((int)local_58 != 0) {
      abs_deadline_02.tv_nsec._0_4_ = (int)local_58;
      abs_deadline_02.tv_sec = 999999999;
      abs_deadline_02.tv_nsec._4_4_ = 0;
      iVar7 = nsync::nsync_wait_n((nsync *)0x0,(void *)0x0,(_func_void_void_ptr *)0x0,
                                  (_func_void_void_ptr *)0x7fffffffffffffff,abs_deadline_02,
                                  (int)pnStack_50,in_stack_ffffffffffffff90);
      if (iVar7 == (int)local_58) {
        pcVar4 = smprintf("nsync_wait_n returned with no waiter ready");
        testing_error_(t_00,1,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O1/cpp/testing/wait_test.c"
                       ,0x6f,pcVar4);
      }
      (&(pnStack_50->parent_child_link).next)[iVar7] =
           *(nsync_dll_element_s_ **)((long)pnStack_50 + (long)(int)local_58 * 8 + -8);
      pcVar6 = (code *)pnStack_50;
      if ((long)(int)local_58 < 1) {
        _DAT_00000000 = 0;
      }
      else {
        local_58._0_4_ = (int)local_58 + -1;
      }
    }
    abs_deadline_01.tv_nsec = (__syscall_slong_t)pcVar6;
    abs_deadline_01.tv_sec = 999999999;
    nsync::nsync_counter_wait((nsync *)c,(nsync_counter)0x7fffffffffffffff,abs_deadline_01);
    lVar5 = 0;
    do {
      nsync::nsync_counter_free(*(nsync_counter *)((long)pvStack_60 + lVar5));
      lVar5 = lVar5 + 0x10;
    } while (lVar5 != 0xa0);
    if (10 < (int)(uint)local_68) {
      lVar5 = 10;
      lVar10 = 0xa0;
      do {
        nsync::nsync_note_free(*(nsync_note *)((long)pvStack_60 + lVar10));
        lVar5 = lVar5 + 1;
        lVar10 = lVar10 + 0x10;
      } while (lVar5 < (int)(uint)local_68);
    }
    if (0 < local_58._4_4_) {
      free(pnStack_50);
    }
    iVar7 = local_3c;
    local_58 = 0;
    pnStack_50 = (nsync_note)0x0;
    if (0 < local_68._4_4_) {
      free(pvStack_60);
    }
    local_68 = 0;
    pvStack_60 = (void *)0x0;
    nsync::nsync_counter_free(c);
    local_3c = iVar7 + 1;
    if (local_3c == 0x1e) {
      return;
    }
  } while( true );
}

Assistant:

static void test_wait_n (testing t) {
	int i;
	int j;
	int k;
	int ncounter = 10;
	int nnote = 10;
	int nnote_expire = 10;
	for (i = 0; i != 30; i++) {
		nsync_counter done = nsync_counter_new (0);
		nsync_time now;
		nsync_time deadline;
		a_waitable aw;
		a_pwaitable apw;
		memset (&aw, 0, sizeof (aw));
		memset (&apw, 0, sizeof (apw));
		now = nsync_time_now ();
		deadline = nsync_time_add (now, nsync_time_ms (100));
		for (j = A_LEN (&aw); A_LEN (&aw) < j+ncounter;) {
			nsync_counter c = nsync_counter_new (0);
			struct nsync_waitable_s *w = &A_PUSH (&aw);
			w->v = c;
			w->funcs = &nsync_counter_waitable_funcs;
			for (k = 0; k != 4 && A_LEN (&aw) < j+ncounter; k++) {
				nsync_counter_add (c, 1);
				nsync_counter_add (done, 1);
				closure_fork (closure_decrement (&decrement_at, c, deadline, done));
			}
		}
		for (j = A_LEN (&aw); A_LEN (&aw) < j+nnote;) {
			nsync_note n = nsync_note_new (NULL, nsync_time_no_deadline);
			struct nsync_waitable_s *w = &A_PUSH (&aw);
			w->v = n;
			w->funcs = &nsync_note_waitable_funcs;
			nsync_counter_add (done, 1);
			closure_fork (closure_notify (&notify_at, n, deadline, done));
			for (k = 0; k != 4 && A_LEN (&aw) < j+nnote; k++) {
				nsync_note cn = nsync_note_new (n, nsync_time_no_deadline);
				struct nsync_waitable_s *lw = &A_PUSH (&aw);
				lw->v = cn;
				lw->funcs = &nsync_note_waitable_funcs;
			}
		}
		for (j = A_LEN (&aw); A_LEN (&aw) < j+nnote_expire;) {
			nsync_note n = nsync_note_new (NULL, deadline);
			struct nsync_waitable_s *w = &A_PUSH (&aw);
			w->v = n;
			w->funcs = &nsync_note_waitable_funcs;
			nsync_counter_add (done, 1);
			closure_fork (closure_notify (&notify_at, n, deadline, done));
			for (k = 0; k != 4 && A_LEN (&aw) < j+nnote; k++) {
				nsync_note cn = nsync_note_new (n, nsync_time_no_deadline);
				struct nsync_waitable_s *lw = &A_PUSH (&aw);
				lw->v = cn;
				lw->funcs = &nsync_note_waitable_funcs;
			}
		}
		if (ncounter + nnote + nnote_expire != A_LEN (&aw)) {
			TEST_ERROR (t, ("array length not equal to number of counters"));
		}
		for (j = 0; j != A_LEN (&aw); j++) {
			A_PUSH (&apw) = &A (&aw, j);
		}
		while (A_LEN (&apw) != 0) {
			k = nsync_wait_n (NULL, NULL, NULL, nsync_time_no_deadline,
					  A_LEN (&apw), &A (&apw, 0));
			if (k == A_LEN (&apw)) {
				TEST_ERROR (t, ("nsync_wait_n returned with no waiter ready"));
			}
			A (&apw, k) = A (&apw, A_LEN (&apw) - 1);
			A_DISCARD (&apw, 1);
		}
		nsync_counter_wait (done, nsync_time_no_deadline);
		for (k = 0; k != ncounter; k++) {
			nsync_counter_free ((nsync_counter) A (&aw, k).v);
		}
		for (; k < A_LEN (&aw); k++) {
			nsync_note_free ((nsync_note) A (&aw, k).v);
		}
		A_FREE (&apw);
		A_FREE (&aw);
		nsync_counter_free (done);
	}
}